

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O0

void __thiscall tf::NonblockingNotifierV2::_notify<true>(NonblockingNotifierV2 *this)

{
  long lVar1;
  ulong uVar2;
  NonblockingNotifierV2 *pNVar3;
  long *in_RDI;
  Waiter *w;
  uint64_t newstate;
  uint64_t signals;
  uint64_t waiters;
  uint64_t state;
  memory_order __b;
  memory_order in_stack_fffffffffffffe14;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  NonblockingNotifierV2 *in_stack_fffffffffffffe58;
  NonblockingNotifierV2 *local_80 [2];
  undefined4 local_6c;
  NonblockingNotifierV2 *local_68;
  memory_order local_60;
  int local_5c;
  undefined4 local_4c;
  long local_48;
  NonblockingNotifierV2 **local_40;
  bool local_29;
  long local_28;
  memory_order local_20;
  undefined4 local_1c;
  long local_18;
  NonblockingNotifierV2 **local_10;
  
  local_6c = 5;
  local_5c = 2;
  local_60 = std::operator&(memory_order_acquire,__memory_order_mask);
  if (local_5c - 1U < 2) {
    local_68 = (NonblockingNotifierV2 *)*in_RDI;
  }
  else if (local_5c == 5) {
    local_68 = (NonblockingNotifierV2 *)*in_RDI;
  }
  else {
    local_68 = (NonblockingNotifierV2 *)*in_RDI;
  }
  local_80[0] = local_68;
  do {
    uVar2 = ((ulong)local_80[0] & 0xfffc000) >> 0xe;
    if ((((ulong)local_80[0] & 0x3fff) == 0x3fff) &&
       (uVar2 == ((ulong)local_80[0] & 0x3fff0000000) >> 0x1c)) {
      return;
    }
    lVar1 = (ulong)((uint)local_80[0] & 0xfffc000) + 0x3fff + uVar2 * 0x10000000;
    local_4c = 4;
    local_48 = lVar1;
    local_40 = local_80;
    local_20 = std::__cmpexch_failure_order(in_stack_fffffffffffffe14);
    local_1c = 4;
    switch(0x1c8d72) {
    default:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      else {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      break;
    case 2:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      else {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      break;
    case 3:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        in_stack_fffffffffffffe58 = (NonblockingNotifierV2 *)*in_RDI;
        in_stack_fffffffffffffe57 = local_80[0] == in_stack_fffffffffffffe58;
        if ((bool)in_stack_fffffffffffffe57) {
          *in_RDI = lVar1;
          in_stack_fffffffffffffe58 = local_80[0];
        }
        UNLOCK();
        local_29 = (bool)in_stack_fffffffffffffe57;
        if (!(bool)in_stack_fffffffffffffe57) {
          local_80[0] = in_stack_fffffffffffffe58;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      else {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      break;
    case 4:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        in_stack_fffffffffffffe14 = CONCAT13(local_29,(int3)in_stack_fffffffffffffe14);
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
      else {
        LOCK();
        pNVar3 = (NonblockingNotifierV2 *)*in_RDI;
        local_29 = local_80[0] == pNVar3;
        if (local_29) {
          *in_RDI = lVar1;
          pNVar3 = local_80[0];
        }
        UNLOCK();
        if (!local_29) {
          local_80[0] = pNVar3;
        }
      }
    }
    local_28 = lVar1;
    local_18 = lVar1;
    local_10 = local_80;
  } while (local_29 == false);
  if (((ulong)local_80[0] & 0x3fff) != 0x3fff) {
    std::
    vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>::
    operator[]((vector<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                *)(in_RDI + 1),(ulong)local_80[0] & 0x3fff);
    _unpark(in_stack_fffffffffffffe58,
            (Waiter *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  }
  return;
}

Assistant:

void _notify() {
    std::atomic_thread_fence(std::memory_order_seq_cst);
    uint64_t state = _state.load(std::memory_order_acquire);
    for (;;) {
      //_check_state(state);
      const uint64_t waiters = (state & kWaiterMask) >> kWaiterShift;
      const uint64_t signals = (state & kSignalMask) >> kSignalShift;
      // Easy case: no waiters.
      if ((state & kStackMask) == kStackMask && waiters == signals) return;
      uint64_t newstate;
      if (notifyAll) {
        // Empty wait stack and set signal to number of pre-wait threads.
        newstate = (state & kWaiterMask) | (waiters << kSignalShift) | kStackMask;
      } else if (signals < waiters) {
        // There is a thread in pre-wait state, unblock it.
        newstate = state + kSignalInc;
      } else {
        // Pop a waiter from list and unpark it.
        Waiter* w = &_waiters[state & kStackMask];
        uint64_t next = w->next.load(std::memory_order_relaxed);
        newstate = (state & (kWaiterMask | kSignalMask)) | next;
      }
      //_check_state(newstate);
      if (_state.compare_exchange_weak(state, newstate, std::memory_order_acq_rel)) {
        if (!notifyAll && (signals < waiters)) return;  // unblocked pre-wait thread
        if ((state & kStackMask) == kStackMask) return;
        Waiter* w = &_waiters[state & kStackMask];
        if (!notifyAll) w->next.store(kStackMask, std::memory_order_relaxed);
        _unpark(w);
        return;
      }
    }
  }